

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

int Lodtalk::Object::stAtPut(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SmallIntegerValue SVar3;
  undefined4 extraout_var_05;
  uint64_t uVar4;
  allocator local_c1;
  string local_c0;
  SmallIntegerValue local_a0;
  uint64_t *local_98;
  uint64_t *data_3;
  uint32_t *data_2;
  uint16_t *data_1;
  uint8_t *data;
  Oop *oopData;
  uint64_t *puStack_68;
  uint format;
  void *firstIndexableField;
  VMContext *context;
  SmallIntegerValue index;
  long local_48;
  SmallIntegerValue size;
  Oop value;
  Oop indexOop;
  Oop self;
  int error;
  InterpreterProxy *interpreter_local;
  
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) == 2) {
    iVar2 = (*interpreter->_vptr_InterpreterProxy[0xb])();
    (*interpreter->_vptr_InterpreterProxy[1])(interpreter,CONCAT44(extraout_var_00,iVar2));
    interpreter_local._4_4_ = stSize(interpreter);
    if (interpreter_local._4_4_ == 0) {
      indexOop.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])();
      indexOop.field_0.uintValue._4_4_ = extraout_var_01;
      value.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
      value.field_0.uintValue._4_4_ = extraout_var_02;
      iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,1);
      size = CONCAT44(extraout_var_03,iVar2);
      iVar2 = (*interpreter->_vptr_InterpreterProxy[6])();
      index = CONCAT44(extraout_var_04,iVar2);
      local_48 = Oop::decodeSmallInteger((Oop *)&index);
      SVar3 = Oop::decodeSmallInteger(&value);
      context = (VMContext *)(SVar3 + -1);
      if ((local_48 < (long)context) || ((long)context < 0)) {
        interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
      }
      else {
        iVar2 = (**interpreter->_vptr_InterpreterProxy)();
        firstIndexableField = (void *)CONCAT44(extraout_var_05,iVar2);
        puStack_68 = (uint64_t *)
                     Oop::getFirstIndexableFieldPointer(&indexOop,(VMContext *)firstIndexableField);
        oopData._4_4_ = (uint)((ulong)*(undefined8 *)indexOop.field_0 >> 0x23) & 0x1f;
        if (oopData._4_4_ < 9) {
          puStack_68[(long)context] = size;
          data = (uint8_t *)puStack_68;
        }
        else if (oopData._4_4_ < 0x10) {
          if (oopData._4_4_ < 0xc) {
            if (oopData._4_4_ < 10) {
              if (oopData._4_4_ == 9) {
                local_a0 = size;
                local_98 = puStack_68;
                uVar4 = VMContext::positiveInt64ValueOf((VMContext *)firstIndexableField,(Oop)size);
                local_98[(long)context] = uVar4;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_c0,"unimplemented",&local_c1);
                nativeError(&local_c0);
                std::__cxx11::string::~string((string *)&local_c0);
                std::allocator<char>::~allocator((allocator<char> *)&local_c1);
              }
            }
            else {
              data_3 = puStack_68;
              bVar1 = Oop::isSmallInteger((Oop *)&size);
              if (!bVar1) {
                iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])();
                return iVar2;
              }
              SVar3 = Oop::decodeSmallInteger((Oop *)&size);
              *(int *)((long)data_3 + (long)context * 4) = (int)SVar3;
            }
          }
          else {
            data_2 = (uint32_t *)puStack_68;
            bVar1 = Oop::isSmallInteger((Oop *)&size);
            if (!bVar1) {
              iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])();
              return iVar2;
            }
            SVar3 = Oop::decodeSmallInteger((Oop *)&size);
            *(short *)((long)data_2 + (long)context * 2) = (short)SVar3;
          }
        }
        else {
          data_1 = (uint16_t *)puStack_68;
          bVar1 = Oop::isSmallInteger((Oop *)&size);
          if (!bVar1) {
            iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])();
            return iVar2;
          }
          SVar3 = Oop::decodeSmallInteger((Oop *)&size);
          *(char *)((long)data_1 + (long)context) = (char)SVar3;
        }
        interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,size);
      }
    }
  }
  else {
    interpreter_local._4_4_ = (*interpreter->_vptr_InterpreterProxy[0x1e])();
  }
  return interpreter_local._4_4_;
}

Assistant:

int Object::stAtPut(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 2)
        return interpreter->primitiveFailed();

    interpreter->pushOop(interpreter->getReceiver());
    auto error = stSize(interpreter);
    if(error != 0)
        return error;

    auto self = interpreter->getReceiver();
    auto indexOop = interpreter->getTemporary(0);
    auto value = interpreter->getTemporary(1);
	auto size = interpreter->popOop().decodeSmallInteger();
	auto index = indexOop.decodeSmallInteger() - 1;
	if(index > size || index < 0)
		return interpreter->primitiveFailed();

    // Set the element.
    auto context = interpreter->getContext();
    auto firstIndexableField = self.getFirstIndexableFieldPointer(context);
    auto format = self.header->objectFormat;
    if(format < OF_INDEXABLE_64)
    {
        auto oopData = reinterpret_cast<Oop*> (firstIndexableField);
        oopData[index] = value;
    }
    else if(format >= OF_INDEXABLE_8)
    {
        auto data = reinterpret_cast<uint8_t*> (firstIndexableField);
        if(!value.isSmallInteger())
            return interpreter->primitiveFailed();

        data[index] = (uint8_t)value.decodeSmallInteger();
    }
    else if(format >= OF_INDEXABLE_16)
    {
        auto data = reinterpret_cast<uint16_t*> (firstIndexableField);
        if(!value.isSmallInteger())
            return interpreter->primitiveFailed();

        data[index] = (uint16_t)value.decodeSmallInteger();
    }
    else if(format >= OF_INDEXABLE_32)
    {
        auto data = reinterpret_cast<uint32_t*> (firstIndexableField);
#ifdef OBJECT_MODEL_SPUR_64
        if(!value.isSmallInteger())
            return interpreter->primitiveFailed();

        data[index] = (uint32_t)value.decodeSmallInteger();
#else
        data[index] = (uint32_t)context->positiveInt32ValueOf(value);
#endif
    }
    else if(format == OF_INDEXABLE_64)
    {
        auto data = reinterpret_cast<uint64_t*> (firstIndexableField);
        data[index] = context->positiveInt64ValueOf(value);
    }
    else
    {
    	nativeError("unimplemented");
    }

    return interpreter->returnOop(value);
}